

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O2

int LZ4_compressHC_limitedOutput_withStateHC
              (void *state,char *src,char *dst,int srcSize,int maxDstSize)

{
  int iVar1;
  
  iVar1 = LZ4_compress_HC_extStateHC(state,src,dst,srcSize,maxDstSize,0);
  return iVar1;
}

Assistant:

int LZ4_compressHC_limitedOutput_withStateHC (void* state, const char* src, char* dst, int srcSize, int maxDstSize) { return LZ4_compress_HC_extStateHC (state, src, dst, srcSize, maxDstSize, 0); }